

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

void * add_to_tmp_buffer(AttrBuffer buf,uint size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  uint uVar4;
  
  iVar1 = buf->tmp_buffer_in_use_size;
  uVar4 = size + iVar1;
  iVar2 = buf->tmp_buffer_size;
  if ((long)iVar2 == 0) {
    uVar3 = 0x80;
    if (0x80 < uVar4) {
      uVar3 = uVar4;
    }
    __ptr = calloc(1,(long)(int)uVar3);
    buf->tmp_buffer = __ptr;
  }
  else {
    __ptr = buf->tmp_buffer;
  }
  if ((long)iVar2 < (long)(ulong)uVar4) {
    __ptr = realloc(__ptr,(ulong)uVar4);
    buf->tmp_buffer = __ptr;
    memset((void *)((long)buf->tmp_buffer_size + (long)__ptr),0,
           (ulong)(uVar4 - buf->tmp_buffer_size));
    buf->tmp_buffer_size = uVar4;
  }
  if (__ptr == (void *)0x0) {
    buf->tmp_buffer_size = 0;
  }
  else {
    buf->tmp_buffer_in_use_size = uVar4;
  }
  return (void *)((long)__ptr + (long)iVar1);
}

Assistant:

static
void *
add_to_tmp_buffer(AttrBuffer buf, unsigned int size)
{
    int old_size = buf->tmp_buffer_in_use_size;
    size += old_size;

    if (buf->tmp_buffer_size == 0) {
	int tmp_size = Max(size, TMP_BUFFER_INIT_SIZE);
	buf->tmp_buffer = malloc(tmp_size * sizeof(char));
	if(buf->tmp_buffer) memset(buf->tmp_buffer, 0, tmp_size * sizeof(char));
    }
    if ((long)size > (long)buf->tmp_buffer_size) {
	buf->tmp_buffer = realloc(buf->tmp_buffer, size);
	memset (((char*)buf->tmp_buffer) + buf->tmp_buffer_size, 0, size - buf->tmp_buffer_size);
	buf->tmp_buffer_size = size;
    }
    if (!buf->tmp_buffer) {
	buf->tmp_buffer_size = 0;
    } else {
	buf->tmp_buffer_in_use_size = size;
    }

    return old_size + (char*)buf->tmp_buffer;
}